

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O2

ResBytes * multihash::encode(ResBytes *__return_storage_ptr__,string *digest,UInt code)

{
  Bytes *in_R8;
  Bytes out;
  Bytes dig;
  OptError err;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binary::decodeHex((Bytes *)&local_50,digest);
  encode_abi_cxx11_((OptError *)&local_38,(multihash *)&local_50,(Bytes *)(ulong)code,
                    (UInt)&local_68,in_R8);
  std::
  _Tuple_impl<0ul,std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::optional<std::__cxx11::string>>
  ::
  _Tuple_impl<std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::optional<std::__cxx11::string>&,void>
            ((_Tuple_impl<0ul,std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::optional<std::__cxx11::string>>
              *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_38);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_38);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  return __return_storage_ptr__;
}

Assistant:

ResBytes encode(std::string digest, UInt code) {
	Bytes out;
	Bytes dig = binary::decodeHex(digest);
	auto err = encode(dig, code, out);
	return {out, err};
}